

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::GetFileSize(PosixEnv *this,string *filename,uint64_t *size)

{
  int iVar1;
  char *__file;
  int *piVar2;
  __syscall_slong_t in_RCX;
  undefined1 local_b8 [8];
  stat file_stat;
  uint64_t *size_local;
  string *filename_local;
  PosixEnv *this_local;
  
  file_stat.__glibc_reserved[2] = in_RCX;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_b8);
  if (iVar1 == 0) {
    *(__dev_t *)file_stat.__glibc_reserved[2] = file_stat.st_rdev;
    Status::OK();
  }
  else {
    *(undefined8 *)file_stat.__glibc_reserved[2] = 0;
    piVar2 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)size,*piVar2);
  }
  return (Status)(char *)this;
}

Assistant:

Status GetFileSize(const std::string& filename, uint64_t* size) override {
    struct ::stat file_stat;
    if (::stat(filename.c_str(), &file_stat) != 0) {
      *size = 0;
      return PosixError(filename, errno);
    }
    *size = file_stat.st_size;
    return Status::OK();
  }